

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

void __thiscall
slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::
ASTContext_const&,slang::SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>&)::Visitor::
handle(slang::syntax::NameSyntax_const__(void *this,NameSyntax *nameSyntax)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bitmask<slang::ast::LookupFlags> flags;
  ASTContext *context;
  ASTContext *pAVar4;
  LookupResult result;
  undefined1 local_2a8 [8];
  ASTContext local_2a0;
  LookupResult local_268;
  
  pAVar4 = (ASTContext *)local_2a8;
  if ((nameSyntax->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) {
    flags.m_bits = 0x400c;
    if (((ulong)(*this)[2] >> 0x2c & 1) == 0) {
      flags.m_bits = 8;
    }
    pcVar1 = local_268.selectors.
             super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
             .firstElement;
    local_268.upwardCount = 0;
    local_268.flags.m_bits = '\0';
    local_268.found = (Symbol *)0x0;
    local_268.systemSubroutine._0_5_ = 0;
    local_268.systemSubroutine._5_3_ = 0;
    local_268.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .len = 0;
    local_268.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .cap = 4;
    pcVar2 = local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
             firstElement;
    local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
    local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
    local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_2a0.scope.ptr = (Scope *)**this;
    context = &local_2a0;
    local_2a0.lookupIndex = 0xffffffff;
    local_2a0.flags.m_bits = 0;
    local_2a0.instanceOrProc = (Symbol *)0x0;
    local_2a0.firstTempVar = (TempVarSymbol *)0x0;
    local_2a0.randomizeDetails = (RandomizeDetails *)0x0;
    local_2a0.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_268.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .data_ = (pointer)pcVar1;
    local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
         (pointer)pcVar2;
    Lookup::name(nameSyntax,context,flags,&local_268);
    if (local_268.found == (Symbol *)0x0) {
      bVar3 = LookupResult::hasError(&local_268);
      if (!bVar3) {
        local_2a8 = (undefined1  [8])nameSyntax;
        SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>::
        emplace_back<slang::syntax::IdentifierNameSyntax_const*>
                  (*(SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*> **)((long)this + 8)
                   ,(IdentifierNameSyntax **)local_2a8);
        context = pAVar4;
      }
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_268.diagnostics,(EVP_PKEY_CTX *)context)
    ;
    if (local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ !=
        (pointer)pcVar2) {
      operator_delete(local_268.path.
                      super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_);
    }
    if (local_268.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .data_ != (pointer)pcVar1) {
      operator_delete(local_268.selectors.
                      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                      .data_);
    }
  }
  return;
}

Assistant:

void handle(const NameSyntax& nameSyntax) {
            if (nameSyntax.kind != SyntaxKind::IdentifierName)
                return;

            bitmask<LookupFlags> flags = LookupFlags::NoUndeclaredError;
            if (context.flags.has(ASTFlags::BindInstantiation))
                flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

            LookupResult result;
            ASTContext ctx(*context.scope, LookupLocation::max);
            Lookup::name(nameSyntax, ctx, flags, result);

            SLANG_ASSERT(!result.flags.has(LookupResultFlags::IsHierarchical));

            if (!result.found && !result.hasError())
                results.push_back(&nameSyntax.as<IdentifierNameSyntax>());
        }